

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

string * __thiscall
QPDFObjectHandle::getUTF8Value_abi_cxx11_(string *__return_storage_ptr__,QPDFObjectHandle *this)

{
  QPDF_String *this_00;
  allocator<char> local_39;
  string local_38;
  
  this_00 = ::qpdf::BaseHandle::as<QPDF_String>(&this->super_BaseHandle);
  if (this_00 == (QPDF_String *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"returning empty string",&local_39);
    typeWarning(this,"string",&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_38);
  }
  else {
    QPDF_String::getUTF8Val_abi_cxx11_(__return_storage_ptr__,this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFObjectHandle::getUTF8Value() const
{
    if (auto str = as<QPDF_String>()) {
        return str->getUTF8Val();
    } else {
        typeWarning("string", "returning empty string");
        QTC::TC("qpdf", "QPDFObjectHandle string returning empty utf8");
        return "";
    }
}